

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_left_predictor_4x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar5;
  undefined4 uVar3;
  ushort uVar6;
  ushort uVar7;
  undefined1 auVar4 [16];
  undefined1 auVar8 [16];
  
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)left;
  auVar8 = psadbw((undefined1  [16])0x0,auVar4);
  auVar4 = pshuflw(auVar4,auVar8,0);
  uVar2 = (ushort)(auVar4._0_2_ + 4U) >> 3;
  uVar5 = (ushort)(auVar4._2_2_ + 4U) >> 3;
  uVar6 = (ushort)(auVar4._4_2_ + 4U) >> 3;
  uVar7 = (ushort)(auVar4._6_2_ + 4U) >> 3;
  uVar3 = CONCAT13((uVar7 != 0) * (uVar7 < 0x100) * (char)uVar7 - (0xff < uVar7),
                   CONCAT12((uVar6 != 0) * (uVar6 < 0x100) * (char)uVar6 - (0xff < uVar6),
                            CONCAT11((uVar5 != 0) * (uVar5 < 0x100) * (char)uVar5 - (0xff < uVar5),
                                     (uVar2 != 0) * (uVar2 < 0x100) * (char)uVar2 - (0xff < uVar2)))
                  );
  for (uVar1 = 0; uVar1 < 8; uVar1 = uVar1 + 2) {
    *(undefined4 *)dst = uVar3;
    *(undefined4 *)(dst + stride) = uVar3;
    dst = dst + stride * 2;
  }
  return;
}

Assistant:

void aom_dc_left_predictor_4x8_sse2(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  (void)above;
  __m128i sum_left = dc_sum_8(left);
  const __m128i four = _mm_set1_epi16(4);
  sum_left = _mm_add_epi16(sum_left, four);
  sum_left = _mm_srai_epi16(sum_left, 3);
  sum_left = _mm_shufflelo_epi16(sum_left, 0);
  sum_left = _mm_packus_epi16(sum_left, sum_left);

  const uint32_t pred = (uint32_t)_mm_cvtsi128_si32(sum_left);
  dc_store_4xh(pred, 8, dst, stride);
}